

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtmidi_c.cpp
# Opt level: O2

double rtmidi_in_get_message(RtMidiInPtr device,uchar *message,size_t *size)

{
  double dVar1;
  ulong uVar2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> v;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_38;
  
  local_38._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  dVar1 = RtMidiIn::getMessage
                    ((RtMidiIn *)device->ptr,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_38);
  uVar2 = (long)local_38._M_impl.super__Vector_impl_data._M_finish -
          (long)local_38._M_impl.super__Vector_impl_data._M_start;
  if ((uVar2 != 0) && (uVar2 <= *size)) {
    memcpy(message,local_38._M_impl.super__Vector_impl_data._M_start,(long)(int)uVar2);
  }
  *size = uVar2;
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_38);
  return dVar1;
}

Assistant:

double rtmidi_in_get_message (RtMidiInPtr device,
                              unsigned char *message,
                              size_t *size)
{
    try {
        // FIXME: use allocator to achieve efficient buffering
        std::vector<unsigned char> v;
        double ret = ((RtMidiIn*) device->ptr)->getMessage (&v);

        if (v.size () > 0 && v.size() <= *size) {
            memcpy (message, v.data (), (int) v.size ());
        }

        *size = v.size();
        return ret;
    }
    catch (const RtMidiError & err) {
        device->ok  = false;
        device->msg = err.what ();
        return -1;
    }
    catch (...) {
        device->ok  = false;
        device->msg = "Unknown error";
        return -1;
    }
}